

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_encoder.h
# Opt level: O0

void __thiscall
draco::MeshEdgebreakerTraversalEncoder::EncodeTraversalSymbols
          (MeshEdgebreakerTraversalEncoder *this)

{
  MeshEncoder *this_00;
  size_type sVar1;
  long lVar2;
  reference pvVar3;
  long in_RDI;
  bool in_stack_0000000f;
  int64_t in_stack_00000010;
  EncoderBuffer *in_stack_00000018;
  int i;
  EncoderBuffer *in_stack_00000060;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar4;
  int local_c;
  
  this_00 = (MeshEncoder *)(**(code **)(**(long **)(in_RDI + 0x68) + 0x50))();
  MeshEncoder::mesh(this_00);
  Mesh::num_faces((Mesh *)0x1a47f9);
  EncoderBuffer::StartBitEncoding(in_stack_00000018,in_stack_00000010,in_stack_0000000f);
  sVar1 = std::
          vector<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
          ::size((vector<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                  *)(in_RDI + 0x70));
  local_c = (int)sVar1;
  while (local_c = local_c + -1, -1 < local_c) {
    lVar2 = in_RDI + 0x38;
    pvVar3 = std::
             vector<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
             ::operator[]((vector<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                           *)(in_RDI + 0x70),(long)local_c);
    uVar4 = *(undefined4 *)(edge_breaker_topology_bit_pattern_length + (ulong)*pvVar3 * 4);
    std::
    vector<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
    ::operator[]((vector<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                  *)(in_RDI + 0x70),(long)local_c);
    EncoderBuffer::EncodeLeastSignificantBits32
              ((EncoderBuffer *)CONCAT44(uVar4,in_stack_ffffffffffffffd8),
               (int)((ulong)lVar2 >> 0x20),(uint32_t)lVar2);
  }
  EncoderBuffer::EndBitEncoding(in_stack_00000060);
  return;
}

Assistant:

void EncodeTraversalSymbols() {
    // Bit encode the collected symbols.
    // Allocate enough storage for the bit encoder.
    // It's guaranteed that each face will need only up to 3 bits.
    traversal_buffer_.StartBitEncoding(
        encoder_impl_->GetEncoder()->mesh()->num_faces() * 3, true);
    for (int i = static_cast<int>(symbols_.size() - 1); i >= 0; --i) {
      traversal_buffer_.EncodeLeastSignificantBits32(
          edge_breaker_topology_bit_pattern_length[symbols_[i]], symbols_[i]);
    }
    traversal_buffer_.EndBitEncoding();
  }